

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O0

Slice __thiscall leveldb::MemTableIterator::value(MemTableIterator *this)

{
  long lVar1;
  long in_FS_OFFSET;
  Slice SVar2;
  Slice key_slice;
  Slice *in_stack_ffffffffffffffa8;
  Iterator *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::key(in_stack_ffffffffffffffb8)
  ;
  GetLengthPrefixedSlice(in_stack_ffffffffffffffc0);
  Slice::data(in_stack_ffffffffffffffa8);
  Slice::size(in_stack_ffffffffffffffa8);
  SVar2 = GetLengthPrefixedSlice(in_stack_ffffffffffffffc0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return SVar2;
  }
  __stack_chk_fail();
}

Assistant:

Slice value() const override {
    Slice key_slice = GetLengthPrefixedSlice(iter_.key());
    return GetLengthPrefixedSlice(key_slice.data() + key_slice.size());
  }